

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.cpp
# Opt level: O3

char * luaF_getlocalname(Proto *f,int param_2,int pc)

{
  LocVar *pLVar1;
  long lVar2;
  
  if ((long)f->sizelocvars < 1) {
    return (char *)0x0;
  }
  pLVar1 = f->locvars;
  lVar2 = 0;
  while( true ) {
    if (pc < *(int *)((long)&pLVar1->startpc + lVar2)) {
      return (char *)0x0;
    }
    if ((pc < *(int *)((long)&pLVar1->endpc + lVar2)) && (param_2 = param_2 + -1, param_2 == 0))
    break;
    lVar2 = lVar2 + 0x10;
    if ((long)f->sizelocvars * 0x10 == lVar2) {
      return (char *)0x0;
    }
  }
  return (char *)(*(long *)((long)&pLVar1->varname + lVar2) + 0x18);
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0)
        return getstr(f->locvars[i].varname);
    }
  }
  return NULL;  /* not found */
}